

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::_::NetworkFilter::NetworkFilter(NetworkFilter *this)

{
  Vector<kj::_::CidrRange> *this_00;
  RemoveConst<kj::_::CidrRange> **ppRVar1;
  CidrRange *pCVar2;
  CidrRange *pCVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  RemoveConst<kj::_::CidrRange> *__dest;
  ulong newSize;
  ArrayPtr<const_kj::_::CidrRange> AVar7;
  ArrayPtr<const_unsigned_char> bits;
  uchar local_4c [4];
  CidrRange local_48;
  
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00629250;
  this_00 = &this->allowCidrs;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::_::CidrRange> *)0x0;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::_::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  this->allowUnix = true;
  this->allowAbstractUnix = true;
  (this->next).ptr = (NetworkFilter *)0x0;
  local_4c[0] = '\0';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  bits.size_ = 4;
  bits.ptr = local_4c;
  CidrRange::CidrRange(&local_48,2,bits,0);
  pCVar3 = (this->allowCidrs).builder.pos;
  if (pCVar3 == (this->allowCidrs).builder.endPtr) {
    pCVar2 = (this_00->builder).ptr;
    sVar5 = 4;
    if (pCVar3 != pCVar2) {
      sVar5 = ((long)pCVar3 - (long)pCVar2 >> 3) * 0x5555555555555556;
    }
    Vector<kj::_::CidrRange>::setCapacity(this_00,sVar5);
    pCVar3 = (this->allowCidrs).builder.pos;
  }
  *(undefined8 *)(pCVar3->bits + 0xc) = local_48._16_8_;
  pCVar3->family = local_48.family;
  pCVar3->bits[0] = local_48.bits[0];
  pCVar3->bits[1] = local_48.bits[1];
  pCVar3->bits[2] = local_48.bits[2];
  pCVar3->bits[3] = local_48.bits[3];
  *(undefined8 *)(pCVar3->bits + 4) = local_48.bits._4_8_;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  CidrRange::inet6(&local_48,(ArrayPtr<const_unsigned_short>)ZEXT816(0),
                   (ArrayPtr<const_unsigned_short>)ZEXT816(0),0);
  pCVar3 = (this->allowCidrs).builder.pos;
  if (pCVar3 == (this->allowCidrs).builder.endPtr) {
    pCVar2 = (this_00->builder).ptr;
    sVar5 = 4;
    if (pCVar3 != pCVar2) {
      sVar5 = ((long)pCVar3 - (long)pCVar2 >> 3) * 0x5555555555555556;
    }
    Vector<kj::_::CidrRange>::setCapacity(this_00,sVar5);
    pCVar3 = (this->allowCidrs).builder.pos;
  }
  *(undefined8 *)(pCVar3->bits + 0xc) = local_48._16_8_;
  pCVar3->family = local_48.family;
  pCVar3->bits[0] = local_48.bits[0];
  pCVar3->bits[1] = local_48.bits[1];
  pCVar3->bits[2] = local_48.bits[2];
  pCVar3->bits[3] = local_48.bits[3];
  *(undefined8 *)(pCVar3->bits + 4) = local_48.bits._4_8_;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  AVar7 = reservedCidrs();
  sVar5 = AVar7.size_;
  pCVar3 = (this->denyCidrs).builder.ptr;
  __dest = (this->denyCidrs).builder.pos;
  uVar4 = ((long)__dest - (long)pCVar3 >> 3) * -0x5555555555555555 + sVar5;
  pCVar2 = (this->denyCidrs).builder.endPtr;
  lVar6 = (long)pCVar2 - (long)pCVar3 >> 3;
  if ((ulong)(lVar6 * -0x5555555555555555) < uVar4) {
    newSize = 4;
    if (pCVar2 != pCVar3) {
      newSize = lVar6 * 0x5555555555555556;
    }
    if (newSize < uVar4) {
      newSize = uVar4;
    }
    Vector<kj::_::CidrRange>::setCapacity(&this->denyCidrs,newSize);
    __dest = (this->denyCidrs).builder.pos;
  }
  if (sVar5 != 0) {
    memcpy(__dest,AVar7.ptr,sVar5 * 0x18);
  }
  (this->denyCidrs).builder.pos = __dest + sVar5;
  return;
}

Assistant:

NetworkFilter::NetworkFilter()
    : allowUnix(true), allowAbstractUnix(true) {
  allowCidrs.add(CidrRange::inet4({0,0,0,0}, 0));
  allowCidrs.add(CidrRange::inet6({}, {}, 0));
  denyCidrs.addAll(reservedCidrs());
}